

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlmodule(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlmodule : 2 of 4 functions ...\n");
  }
  iVar1 = test_xmlModuleClose();
  iVar2 = test_xmlModuleOpen();
  iVar3 = test_xmlModuleSymbol();
  uVar4 = iVar3 + iVar2 + iVar1;
  if (uVar4 != 0) {
    printf("Module xmlmodule: %d errors\n",(ulong)uVar4);
  }
  return uVar4;
}

Assistant:

static int
test_xmlmodule(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlmodule : 2 of 4 functions ...\n");
    test_ret += test_xmlModuleClose();
    test_ret += test_xmlModuleOpen();
    test_ret += test_xmlModuleSymbol();

    if (test_ret != 0)
	printf("Module xmlmodule: %d errors\n", test_ret);
    return(test_ret);
}